

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

opvar * opvar_var_conversion(sp_coder *coder,opvar *ov)

{
  int iVar1;
  opvar *poVar2;
  opvar *array_idx;
  opvar *tmpov;
  splev_var *tmp;
  opvar *ov_local;
  sp_coder *coder_local;
  
  if ((coder == (sp_coder *)0x0) || (ov == (opvar *)0x0)) {
    coder_local = (sp_coder *)0x0;
  }
  else {
    coder_local = (sp_coder *)ov;
    if (ov->spovartyp == '\x03') {
      for (tmpov = (opvar *)coder->frame->variables; tmpov != (opvar *)0x0; tmpov = *(opvar **)tmpov
          ) {
        iVar1 = strcmp((tmpov->vardata).str,(ov->vardata).str);
        if (iVar1 == 0) {
          if ((tmpov[1].spovartyp & 0x40U) == 0) {
            poVar2 = opvar_clone((opvar *)tmpov[1].vardata.str);
            return poVar2;
          }
          poVar2 = splev_stack_pop(coder->stack);
          poVar2 = opvar_var_conversion(coder,poVar2);
          if ((poVar2 != (opvar *)0x0) && (poVar2->spovartyp == '\x01')) {
            if (0 < *(long *)(tmpov + 2)) {
              (poVar2->vardata).l = (poVar2->vardata).l % *(long *)(tmpov + 2);
              poVar2 = opvar_clone(*(opvar **)(tmpov[1].vardata.str + (poVar2->vardata).l * 8));
              return poVar2;
            }
            panic("array len < 1");
          }
          panic("array idx not an int");
        }
      }
      coder_local = (sp_coder *)0x0;
    }
  }
  return (opvar *)coder_local;
}

Assistant:

static struct opvar *opvar_var_conversion(struct sp_coder *coder, struct opvar *ov)
{
	struct splev_var *tmp;
	struct opvar *tmpov;
	struct opvar *array_idx = NULL;

	if (!coder || !ov) return NULL;
	if (ov->spovartyp != SPOVAR_VARIABLE) return ov;

	tmp = coder->frame->variables;
	while (tmp) {
	    if (!strcmp(tmp->name, OV_s(ov))) {
		if (tmp->svtyp & SPOVAR_ARRAY) {
		    array_idx = opvar_var_conversion(coder,
						     splev_stack_pop(coder->stack));
		    if (!array_idx || OV_typ(array_idx) != SPOVAR_INT)
			panic("array idx not an int");
		    if (tmp->array_len < 1)
			panic("array len < 1");
		    OV_i(array_idx) = (OV_i(array_idx) % tmp->array_len);
		    tmpov = opvar_clone(tmp->data.arrayvalues[OV_i(array_idx)]);
		    return tmpov;
		} else {
		    tmpov = opvar_clone(tmp->data.value);
		    return tmpov;
		}
	    }
	    tmp = tmp->next;
	}

	return NULL;
}